

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_purp.cc
# Opt level: O0

uint32_t X509_get_key_usage(X509 *x)

{
  int iVar1;
  X509 *x_local;
  
  iVar1 = x509v3_cache_extensions(x);
  if (iVar1 == 0) {
    x_local._4_4_ = 0;
  }
  else if ((x->ex_flags & 2) == 0) {
    x_local._4_4_ = 0xffffffff;
  }
  else {
    x_local._4_4_ = x->ex_kusage;
  }
  return x_local._4_4_;
}

Assistant:

uint32_t X509_get_key_usage(X509 *x) {
  if (!x509v3_cache_extensions(x)) {
    return 0;
  }
  if (x->ex_flags & EXFLAG_KUSAGE) {
    return x->ex_kusage;
  }
  // If there is no extension, key usage is unconstrained, so set all bits to
  // one. Note that, although we use |UINT32_MAX|, |ex_kusage| only contains the
  // first 16 bits when the extension is present.
  return UINT32_MAX;
}